

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O1

VecPtr * __thiscall SpeciesTracker::FindReactions(SpeciesTracker *this,string *species_name)

{
  const_iterator cVar1;
  mapped_type *pmVar2;
  runtime_error *this_00;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>_>_>
          ::find(&(this->species_map_)._M_t,species_name);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->species_map_)._M_t._M_impl.super__Rb_tree_header)
  {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>_>_>
             ::operator[](&this->species_map_,species_name);
    return pmVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Species not found in tracker.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Reaction::VecPtr &SpeciesTracker::FindReactions(
    const std::string &species_name) {
  if (species_map_.count(species_name) == 0) {
    throw std::runtime_error("Species not found in tracker.");
  }
  return species_map_[species_name];
}